

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

bool deqp::egl::anon_unknown_0::compareColor(Vec4 *a,Vec4 *b)

{
  uint uVar1;
  float fVar2;
  
  fVar2 = a->m_data[0] - b->m_data[0];
  uVar1 = -(uint)(-fVar2 <= fVar2);
  if ((((float)(~uVar1 & (uint)-fVar2 | (uint)fVar2 & uVar1) < 0.005) &&
      (fVar2 = a->m_data[1] - b->m_data[1], uVar1 = -(uint)(-fVar2 <= fVar2),
      (float)(~uVar1 & (uint)-fVar2 | (uint)fVar2 & uVar1) < 0.005)) &&
     (fVar2 = a->m_data[2] - b->m_data[2], uVar1 = -(uint)(-fVar2 <= fVar2),
     (float)(~uVar1 & (uint)-fVar2 | (uint)fVar2 & uVar1) < 0.005)) {
    fVar2 = a->m_data[3] - b->m_data[3];
    uVar1 = -(uint)(-fVar2 <= fVar2);
    return (float)(~uVar1 & (uint)-fVar2 | (uint)fVar2 & uVar1) < 0.005;
  }
  return false;
}

Assistant:

T						w			(void) const { DE_STATIC_ASSERT(Size >= 4); return m_data[3]; }